

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O0

void __thiscall
QGraphicsItemAnimation::setTimeLine(QGraphicsItemAnimation *this,QTimeLine *timeLine)

{
  bool bVar1;
  char *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  QTimeLine *in_stack_ffffffffffffffc8;
  QTimeLine *in_stack_ffffffffffffffd0;
  Connection local_18;
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  bVar1 = ::operator==((QPointer<QTimeLine> *)in_stack_ffffffffffffffd0,
                       (QTimeLine **)in_stack_ffffffffffffffc8);
  if (!bVar1) {
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QTimeLine> *)0xa61139);
    if ((bVar1) &&
       (in_stack_ffffffffffffffd0 =
             ::QPointer::operator_cast_to_QTimeLine_((QPointer<QTimeLine> *)0xa61151),
       in_stack_ffffffffffffffd0 != (QTimeLine *)0x0)) {
      (**(code **)(*(long *)in_stack_ffffffffffffffd0 + 0x20))();
    }
    if (local_10 != (char *)0x0) {
      QPointer<QTimeLine>::operator=
                ((QPointer<QTimeLine> *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      QObject::connect((QObject *)&local_18,local_10,(QObject *)"2valueChanged(qreal)",in_RDI,
                       0xb4a2d5);
      QMetaObject::Connection::~Connection(&local_18);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItemAnimation::setTimeLine(QTimeLine *timeLine)
{
    if (d->timeLine == timeLine)
        return;
    if (d->timeLine)
        delete d->timeLine;
    if (!timeLine)
        return;
    d->timeLine = timeLine;
    connect(timeLine, SIGNAL(valueChanged(qreal)), this, SLOT(setStep(qreal)));
}